

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_conn.cc
# Opt level: O0

Packet * __thiscall iqxmlrpc::Server_connection::read_request(Server_connection *this,string *s)

{
  bool bVar1;
  Verification_level lev;
  size_t m;
  Packet *this_00;
  Header *this_01;
  Malformed_packet *anon_var_0;
  Packet *r;
  string *s_local;
  Server_connection *this_local;
  
  lev = Server::get_verification_level(this->server);
  http::Packet_reader::set_verification_level(&this->preader,lev);
  m = Server::get_max_request_sz(this->server);
  http::Packet_reader::set_max_size(&this->preader,m);
  this_00 = http::Packet_reader::read_request(&this->preader,s);
  if (this_00 == (Packet *)0x0) {
    bVar1 = http::Packet_reader::expect_continue(&this->preader);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&this->response,"HTTP/1.1 100\r\n\r\n");
      this->keep_alive = true;
      (*this->_vptr_Server_connection[2])();
      http::Packet_reader::set_continue_sent(&this->preader);
    }
  }
  else {
    this_01 = http::Packet::header(this_00);
    bVar1 = http::Header::conn_keep_alive(this_01);
    this->keep_alive = bVar1;
  }
  return this_00;
}

Assistant:

http::Packet* Server_connection::read_request( const std::string& s )
{
  try
  {
    preader.set_verification_level( server->get_verification_level() );
    preader.set_max_size( server->get_max_request_sz() );
    http::Packet* r = preader.read_request(s);

    if( r ) {
      keep_alive = r->header()->conn_keep_alive();
    } else if( preader.expect_continue() ) {
      response = "HTTP/1.1 100\r\n\r\n";
      keep_alive = true;
      do_schedule_response();
      preader.set_continue_sent();
    }

    return r;
  }
  catch( const http::Malformed_packet& )
  {
    throw http::Bad_request();
  }
}